

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

DefinitionLookupResult * __thiscall
slang::ast::Compilation::getDefinition
          (DefinitionLookupResult *__return_storage_ptr__,Compilation *this,string_view name,
          Scope *scope,SourceRange sourceRange,BindDirectiveInfo *bindInfo)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  ModuleDeclarationSyntax *syntax;
  ulong uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  SyntaxNode *syntax_00;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  DefinitionSymbol *pDVar9;
  ulong uVar10;
  long lVar11;
  ConfigRule *pCVar12;
  byte bVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  byte bVar20;
  byte bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  __return_storage_ptr__->configRule = (ConfigRule *)0x0;
  __return_storage_ptr__->definition = (Symbol *)0x0;
  __return_storage_ptr__->configRoot = (ConfigBlockSymbol *)0x0;
  syntax = (ModuleDeclarationSyntax *)bindInfo->instantiationDefSyntax;
  if (syntax != (ModuleDeclarationSyntax *)0x0) {
    if ((syntax->super_MemberSyntax).super_SyntaxNode.kind == UdpDeclaration) {
      Scope::addDiag(scope,(DiagCode)0xa0006,sourceRange);
      goto LAB_0014db50;
    }
    pDVar9 = getDefinition(this,scope,syntax);
    __return_storage_ptr__->definition = &pDVar9->super_Symbol;
    if (pDVar9 != (DefinitionSymbol *)0x0) goto LAB_0014db50;
  }
  errorMissingDef(this,name,scope,sourceRange,(DiagCode)0xcf0006);
LAB_0014db50:
  auVar7._8_8_ = 0;
  auVar7._0_8_ = bindInfo->configBlockSyntax;
  uVar14 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar3 = (this->configBySyntax).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
          .arrays.groups_size_mask;
  bVar13 = (byte)(this->configBySyntax).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                 .arrays.groups_size_index;
  uVar10 = uVar14 >> (bVar13 & 0x3f);
  pgVar4 = (this->configBySyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
           .arrays.groups_;
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar14 & 0xff];
  ppVar5 = (this->configBySyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
           .arrays.elements_;
  uVar16 = 0;
  do {
    pgVar1 = pgVar4 + uVar10;
    bVar21 = pgVar1->m[0xf].n;
    uVar17 = (uchar)uVar2;
    auVar22[0] = -(pgVar1->m[0].n == uVar17);
    uVar18 = (uchar)((uint)uVar2 >> 8);
    auVar22[1] = -(pgVar1->m[1].n == uVar18);
    uVar19 = (uchar)((uint)uVar2 >> 0x10);
    auVar22[2] = -(pgVar1->m[2].n == uVar19);
    bVar20 = (byte)((uint)uVar2 >> 0x18);
    auVar22[3] = -(pgVar1->m[3].n == bVar20);
    auVar22[4] = -(pgVar1->m[4].n == uVar17);
    auVar22[5] = -(pgVar1->m[5].n == uVar18);
    auVar22[6] = -(pgVar1->m[6].n == uVar19);
    auVar22[7] = -(pgVar1->m[7].n == bVar20);
    auVar22[8] = -(pgVar1->m[8].n == uVar17);
    auVar22[9] = -(pgVar1->m[9].n == uVar18);
    auVar22[10] = -(pgVar1->m[10].n == uVar19);
    auVar22[0xb] = -(pgVar1->m[0xb].n == bVar20);
    auVar22[0xc] = -(pgVar1->m[0xc].n == uVar17);
    auVar22[0xd] = -(pgVar1->m[0xd].n == uVar18);
    auVar22[0xe] = -(pgVar1->m[0xe].n == uVar19);
    auVar22[0xf] = -(bVar21 == bVar20);
    for (uVar15 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe); uVar15 != 0;
        uVar15 = uVar15 - 1 & uVar15) {
      iVar6 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
        }
      }
      if (bindInfo->configBlockSyntax ==
          *(SyntaxNode **)((long)&ppVar5[uVar10 * 0xf].first + (ulong)(uint)(iVar6 << 4))) {
        __return_storage_ptr__->configRoot =
             *(ConfigBlockSymbol **)((long)&ppVar5[uVar10 * 0xf].second + (ulong)(uint)(iVar6 << 4))
        ;
        goto LAB_0014dc2d;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7] & bVar21) == 0) break;
    lVar11 = uVar10 + uVar16;
    uVar16 = uVar16 + 1;
    uVar10 = lVar11 + 1U & uVar3;
  } while (uVar16 <= uVar3);
LAB_0014dc2d:
  syntax_00 = bindInfo->configRuleSyntax;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = syntax_00;
  uVar16 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar10 = uVar16 >> (bVar13 & 0x3f);
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar16 & 0xff];
  uVar14 = 0;
  do {
    pgVar1 = pgVar4 + uVar10;
    bVar13 = pgVar1->m[0xf].n;
    uVar17 = (uchar)uVar2;
    auVar23[0] = -(pgVar1->m[0].n == uVar17);
    uVar18 = (uchar)((uint)uVar2 >> 8);
    auVar23[1] = -(pgVar1->m[1].n == uVar18);
    uVar19 = (uchar)((uint)uVar2 >> 0x10);
    auVar23[2] = -(pgVar1->m[2].n == uVar19);
    bVar21 = (byte)((uint)uVar2 >> 0x18);
    auVar23[3] = -(pgVar1->m[3].n == bVar21);
    auVar23[4] = -(pgVar1->m[4].n == uVar17);
    auVar23[5] = -(pgVar1->m[5].n == uVar18);
    auVar23[6] = -(pgVar1->m[6].n == uVar19);
    auVar23[7] = -(pgVar1->m[7].n == bVar21);
    auVar23[8] = -(pgVar1->m[8].n == uVar17);
    auVar23[9] = -(pgVar1->m[9].n == uVar18);
    auVar23[10] = -(pgVar1->m[10].n == uVar19);
    auVar23[0xb] = -(pgVar1->m[0xb].n == bVar21);
    auVar23[0xc] = -(pgVar1->m[0xc].n == uVar17);
    auVar23[0xd] = -(pgVar1->m[0xd].n == uVar18);
    auVar23[0xe] = -(pgVar1->m[0xe].n == uVar19);
    auVar23[0xf] = -(bVar13 == bVar21);
    for (uVar15 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe); uVar15 != 0;
        uVar15 = uVar15 - 1 & uVar15) {
      iVar6 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
        }
      }
      if (syntax_00 ==
          *(SyntaxNode **)((long)&ppVar5[uVar10 * 0xf].first + (ulong)(uint)(iVar6 << 4))) {
        pCVar12 = ConfigBlockSymbol::findRuleFromSyntax
                            (*(ConfigBlockSymbol **)
                              ((long)&ppVar5[uVar10 * 0xf].second + (ulong)(uint)(iVar6 << 4)),
                             syntax_00);
        __return_storage_ptr__->configRule = pCVar12;
        return __return_storage_ptr__;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7] & bVar13) == 0) {
      return __return_storage_ptr__;
    }
    lVar11 = uVar10 + uVar14;
    uVar14 = uVar14 + 1;
    uVar10 = lVar11 + 1U & uVar3;
  } while (uVar14 <= uVar3);
  return __return_storage_ptr__;
}

Assistant:

Compilation::DefinitionLookupResult Compilation::getDefinition(
    std::string_view name, const Scope& scope, SourceRange sourceRange,
    const BindDirectiveInfo& bindInfo) const {

    DefinitionLookupResult result;
    if (bindInfo.instantiationDefSyntax) {
        switch (bindInfo.instantiationDefSyntax->kind) {
            case SyntaxKind::ModuleDeclaration:
            case SyntaxKind::InterfaceDeclaration:
            case SyntaxKind::ProgramDeclaration: {
                auto& mds = bindInfo.instantiationDefSyntax->as<ModuleDeclarationSyntax>();
                result.definition = getDefinition(scope, mds);
                if (!result.definition)
                    errorMissingDef(name, scope, sourceRange, diag::UnknownModule);
                break;
            }
            case SyntaxKind::UdpDeclaration:
                scope.addDiag(diag::BindTargetPrimitive, sourceRange);
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }
    else {
        errorMissingDef(name, scope, sourceRange, diag::UnknownModule);
    }

    if (auto it = configBySyntax.find(bindInfo.configBlockSyntax); it != configBySyntax.end())
        result.configRoot = it->second;

    if (auto it = configBySyntax.find(bindInfo.configRuleSyntax); it != configBySyntax.end()) {
        // This rule maps to a config block, so map further to the actual rule object.
        result.configRule = it->second->findRuleFromSyntax(*bindInfo.configRuleSyntax);
    }

    return result;
}